

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugInfoEntry.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFDebugInfoEntry::extractFast
          (DWARFDebugInfoEntry *this,DWARFUnit *U,uint64_t *OffsetPtr,
          DWARFDataExtractor *DebugInfoData,uint64_t UEndOffset,uint32_t D)

{
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  DWARFAbbreviationDeclarationSet *this_00;
  DWARFAbbreviationDeclaration *this_01;
  uint uVar4;
  AttributeSpec *AttrSpec;
  AttributeSpec *this_02;
  ulong uVar5;
  long lVar6;
  Optional<unsigned_long> OVar7;
  Optional<long> OVar8;
  
  uVar5 = *OffsetPtr;
  this->Offset = uVar5;
  this->Depth = D;
  bVar1 = false;
  if ((uVar5 < UEndOffset) && (uVar5 < (DebugInfoData->super_DataExtractor).Data.Length)) {
    uVar3 = DataExtractor::getULEB128(&DebugInfoData->super_DataExtractor,OffsetPtr,(Error *)0x0);
    if (uVar3 == 0) {
      this->AbbrevDecl = (DWARFAbbreviationDeclaration *)0x0;
    }
    else {
      this_00 = DWARFUnit::getAbbreviations(U);
      if (this_00 == (DWARFAbbreviationDeclarationSet *)0x0) {
        this_01 = (DWARFAbbreviationDeclaration *)0x0;
      }
      else {
        this_01 = DWARFAbbreviationDeclarationSet::getAbbreviationDeclaration
                            (this_00,(uint32_t)uVar3);
      }
      this->AbbrevDecl = this_01;
      if (this_01 == (DWARFAbbreviationDeclaration *)0x0) {
        *OffsetPtr = this->Offset;
        return false;
      }
      OVar7 = DWARFAbbreviationDeclaration::getFixedAttributesByteSize(this_01,U);
      if (((undefined1  [16])OVar7.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar5 = (ulong)(this->AbbrevDecl->AttributeSpecs).
                       super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                       super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                       .
                       super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                       .super_SmallVectorBase.Size;
        if (uVar5 != 0) {
          this_02 = (AttributeSpec *)
                    (this->AbbrevDecl->AttributeSpecs).
                    super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                    super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                    .
                    super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                    .super_SmallVectorBase.BeginX;
          lVar6 = uVar5 << 4;
          bVar1 = true;
          do {
            OVar8 = DWARFAbbreviationDeclaration::AttributeSpec::getByteSize(this_02,U);
            if (((undefined1  [16])OVar8.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            {
              bVar2 = DWARFFormValue::skipValue
                                (this_02->Form,DebugInfoData->super_DataExtractor,OffsetPtr,
                                 (U->Header).FormParams);
              uVar4 = 1;
              if (!bVar2) {
                uVar3 = this->Offset;
                bVar1 = false;
                goto LAB_00afdcd1;
              }
            }
            else {
              uVar3 = OVar8.Storage.field_0.value + *OffsetPtr;
LAB_00afdcd1:
              *OffsetPtr = uVar3;
              uVar4 = OVar8.Storage._8_4_;
            }
            if ((uVar4 & 1) == 0) {
              return bVar1;
            }
            this_02 = this_02 + 1;
            lVar6 = lVar6 + -0x10;
            if (lVar6 == 0) {
              return true;
            }
          } while( true );
        }
      }
      else {
        *OffsetPtr = *OffsetPtr + OVar7.Storage.field_0.value;
      }
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool DWARFDebugInfoEntry::extractFast(const DWARFUnit &U, uint64_t *OffsetPtr,
                                      const DWARFDataExtractor &DebugInfoData,
                                      uint64_t UEndOffset, uint32_t D) {
  Offset = *OffsetPtr;
  Depth = D;
  if (Offset >= UEndOffset || !DebugInfoData.isValidOffset(Offset))
    return false;
  uint64_t AbbrCode = DebugInfoData.getULEB128(OffsetPtr);
  if (0 == AbbrCode) {
    // NULL debug tag entry.
    AbbrevDecl = nullptr;
    return true;
  }
  if (auto* Abbreviations = U.getAbbreviations()) { // XXX BINARYEN
    AbbrevDecl = Abbreviations->getAbbreviationDeclaration(AbbrCode);
  } else {
    AbbrevDecl = nullptr; // XXX BINARYEN
  }
  if (nullptr == AbbrevDecl) {
    // Restore the original offset.
    *OffsetPtr = Offset;
    return false;
  }
  // See if all attributes in this DIE have fixed byte sizes. If so, we can
  // just add this size to the offset to skip to the next DIE.
  if (Optional<size_t> FixedSize = AbbrevDecl->getFixedAttributesByteSize(U)) {
    *OffsetPtr += *FixedSize;
    return true;
  }

  // Skip all data in the .debug_info for the attributes
  for (const auto &AttrSpec : AbbrevDecl->attributes()) {
    // Check if this attribute has a fixed byte size.
    if (auto FixedSize = AttrSpec.getByteSize(U)) {
      // Attribute byte size if fixed, just add the size to the offset.
      *OffsetPtr += *FixedSize;
    } else if (!DWARFFormValue::skipValue(AttrSpec.Form, DebugInfoData,
                                          OffsetPtr, U.getFormParams())) {
      // We failed to skip this attribute's value, restore the original offset
      // and return the failure status.
      *OffsetPtr = Offset;
      return false;
    }
  }
  return true;
}